

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::ProcessEdgesAtTopOfScanbeam(Clipper *this,long64 topY)

{
  HorzJoinRec *pHVar1;
  TEdge *e2;
  long lVar2;
  long lVar3;
  double dVar4;
  IntPoint pt1a;
  IntPoint pt1b;
  IntPoint pt2a;
  IntPoint pt2;
  IntPoint pt2_00;
  IntPoint pt4;
  IntPoint pt2b;
  IntPoint pt4_00;
  Clipper *pCVar5;
  bool bVar6;
  long lVar7;
  TEdge *pTVar8;
  TEdge **ppTVar9;
  TEdge **ppTVar10;
  TEdge *pTVar11;
  pointer ppHVar12;
  ulong uVar13;
  IntPoint pt1;
  IntPoint pt1_00;
  IntPoint pt3;
  IntPoint pt3_00;
  TEdge *local_b0;
  IntPoint local_a8;
  Clipper *local_98;
  pointer local_90;
  TEdge **local_88;
  long64 local_80;
  long64 local_78;
  long lStack_70;
  long64 local_68;
  long64 lStack_60;
  long64 local_58;
  long64 lStack_50;
  IntPoint local_48;
  
  pTVar11 = this->m_ActiveEdges;
  local_b0 = pTVar11;
  if (pTVar11 != (TEdge *)0x0) {
    ppTVar9 = &this->m_ActiveEdges;
    local_98 = this;
    local_88 = ppTVar9;
    local_80 = topY;
    do {
      local_b0 = pTVar11;
      if (pTVar11->ytop == topY) {
        if (pTVar11->nextInLML != (TEdge *)0x0) {
LAB_0066700b:
          if ((pTVar11->nextInLML == (TEdge *)0x0) || (1e-20 <= ABS(pTVar11->nextInLML->dx + 1e+40))
             ) {
            lVar7 = pTVar11->xtop;
            goto LAB_006671d0;
          }
          if (-1 < pTVar11->outIdx) {
            local_a8.X = pTVar11->xtop;
            local_a8.Y = topY;
            AddOutPt(this,pTVar11,&local_a8);
            ppHVar12 = (this->m_HorizJoins).
                       super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            local_90 = (this->m_HorizJoins).
                       super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (local_90 != ppHVar12) {
              uVar13 = 0;
              do {
                local_a8.X = 0;
                local_a8.Y = 0;
                local_48.X = 0;
                local_48.Y = 0;
                pHVar1 = ppHVar12[uVar13];
                pTVar8 = pHVar1->edge;
                pt1a.X = pTVar8->xbot;
                pt1a.Y = pTVar8->ybot;
                pt1b.X = pTVar8->xtop;
                pt1b.Y = pTVar8->ytop;
                e2 = pTVar11->nextInLML;
                pt2a.X = e2->xbot;
                pt2a.Y = e2->ybot;
                local_58 = e2->xtop;
                lStack_50 = e2->ytop;
                pt2b.X = e2->xtop;
                pt2b.Y = e2->ytop;
                bVar6 = GetOverlapSegment(pt1a,pt1b,pt2a,pt2b,&local_a8,&local_48);
                pCVar5 = local_98;
                if (bVar6) {
                  AddJoin(local_98,pTVar8,e2,pHVar1->savedIdx,pTVar11->outIdx);
                  ppHVar12 = (pCVar5->m_HorizJoins).
                             super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_90 = (pCVar5->m_HorizJoins).
                             super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 < (ulong)((long)local_90 - (long)ppHVar12 >> 3));
            }
            this = local_98;
            AddHorzJoin(local_98,pTVar11->nextInLML,pTVar11->outIdx);
            topY = local_80;
            ppTVar9 = local_88;
          }
          UpdateEdgeIntoAEL(this,&local_b0);
          if (this->m_SortedEdges == (TEdge *)0x0) {
            this->m_SortedEdges = local_b0;
            local_b0->nextInSEL = (TEdge *)0x0;
            local_b0->prevInSEL = (TEdge *)0x0;
          }
          else {
            local_b0->nextInSEL = this->m_SortedEdges;
            local_b0->prevInSEL = (TEdge *)0x0;
            this->m_SortedEdges->prevInSEL = local_b0;
            this->m_SortedEdges = local_b0;
          }
          goto LAB_006671d8;
        }
        pTVar8 = pTVar11->next;
        if ((pTVar8 == (TEdge *)0x0) || (pTVar8->ytop != topY)) {
          if (pTVar11->prev->dx + 1e+40 <= -1e-20) goto LAB_00667292;
LAB_00667242:
          pTVar8 = pTVar11->prev;
LAB_00667246:
          if (pTVar8->dx + 1e+40 < 1e-20) goto LAB_0066700b;
        }
        else if ((pTVar8->nextInLML == (TEdge *)0x0) && (pTVar8->xtop == pTVar11->xtop)) {
          if (-1e-20 < pTVar8->dx + 1e+40) {
LAB_0066727f:
            if ((pTVar8->nextInLML != (TEdge *)0x0) || (pTVar8->xtop != pTVar11->xtop))
            goto LAB_00667242;
            goto LAB_00667246;
          }
        }
        else if (-1e-20 < pTVar11->prev->dx + 1e+40) {
          if (pTVar8->ytop != topY) goto LAB_00667242;
          goto LAB_0066727f;
        }
LAB_00667292:
        pTVar8 = pTVar11->prevInAEL;
        DoMaxima(local_98,pTVar11,topY);
        this = local_98;
        ppTVar10 = &pTVar8->nextInAEL;
        if (pTVar8 == (TEdge *)0x0) {
          ppTVar10 = ppTVar9;
        }
      }
      else {
        dVar4 = (double)(topY - pTVar11->ybot) * pTVar11->dx;
        lVar7 = (long)(dVar4 + *(double *)(&DAT_006fce40 + (ulong)(dVar4 < 0.0) * 8)) +
                pTVar11->xbot;
LAB_006671d0:
        pTVar11->xcurr = lVar7;
        pTVar11->ycurr = topY;
LAB_006671d8:
        ppTVar10 = &local_b0->nextInAEL;
      }
      pTVar11 = *ppTVar10;
    } while (pTVar11 != (TEdge *)0x0);
    local_b0 = (TEdge *)0x0;
  }
  ProcessHorizontals(this);
  pTVar11 = this->m_ActiveEdges;
  if (pTVar11 != (TEdge *)0x0) {
    do {
      if ((pTVar11->ytop == topY) && (pTVar11->nextInLML != (TEdge *)0x0)) {
        local_b0 = pTVar11;
        if (-1 < pTVar11->outIdx) {
          local_a8.X = pTVar11->xtop;
          local_a8.Y = topY;
          AddOutPt(this,pTVar11,&local_a8);
        }
        UpdateEdgeIntoAEL(this,&local_b0);
        pTVar11 = local_b0;
        if (-1 < local_b0->outIdx) {
          pTVar8 = local_b0->prevInAEL;
          if ((((pTVar8 == (TEdge *)0x0) || (pTVar8->outIdx < 0)) ||
              (lVar7 = pTVar8->xcurr, lVar7 != local_b0->xbot)) ||
             (lVar2 = pTVar8->ycurr, lVar2 != local_b0->ybot)) {
LAB_0066741c:
            pTVar8 = pTVar11->nextInAEL;
            if ((pTVar8 != (TEdge *)0x0) && (-1 < pTVar8->outIdx)) {
              lVar7 = pTVar8->ycurr;
              lVar2 = pTVar8->ytop;
              if (((lVar2 < lVar7) &&
                  ((lVar7 <= pTVar8->ybot && (lVar3 = pTVar8->xcurr, lVar3 == pTVar11->xbot)))) &&
                 (lVar7 == pTVar11->ybot)) {
                pt2_00.X = pTVar11->xtop;
                pt2_00.Y = pTVar11->ytop;
                local_78 = pTVar8->xtop;
                pt4.Y = lVar2;
                pt4.X = local_78;
                pt1_00.Y = lVar7;
                pt1_00.X = lVar3;
                pt3_00.Y = lVar7;
                pt3_00.X = lVar3;
                lStack_70 = lVar2;
                bVar6 = SlopesEqual(pt1_00,pt2_00,pt3_00,pt4,
                                    (bool)(this->_vptr_Clipper[-3] + 0x10)
                                          [(long)&(this->m_PolyOuts).
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                          ]);
                if (bVar6) {
                  ppTVar9 = &pTVar11->nextInAEL;
                  pTVar8 = pTVar11->nextInAEL;
                  goto LAB_006673d9;
                }
              }
            }
          }
          else {
            pt2.X = local_b0->xtop;
            pt2.Y = local_b0->ytop;
            local_68 = pTVar8->xtop;
            lStack_60 = pTVar8->ytop;
            pt4_00.X = pTVar8->xtop;
            pt4_00.Y = pTVar8->ytop;
            pt1.Y = lVar2;
            pt1.X = lVar7;
            pt3.Y = lVar2;
            pt3.X = lVar7;
            bVar6 = SlopesEqual(pt1,pt2,pt3,pt4_00,
                                (bool)(this->_vptr_Clipper[-3] + 0x10)
                                      [(long)&(this->m_PolyOuts).
                                              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                      ]);
            if (!bVar6) {
              if (pTVar11->outIdx < 0) goto LAB_0066749e;
              goto LAB_0066741c;
            }
            ppTVar9 = &pTVar11->prevInAEL;
            pTVar8 = pTVar11->prevInAEL;
LAB_006673d9:
            local_a8.X = pTVar11->xbot;
            local_a8.Y = pTVar11->ybot;
            AddOutPt(this,pTVar8,&local_a8);
            AddJoin(this,pTVar11,*ppTVar9,-1,-1);
          }
        }
      }
LAB_0066749e:
      pTVar11 = pTVar11->nextInAEL;
    } while (pTVar11 != (TEdge *)0x0);
  }
  return;
}

Assistant:

void Clipper::ProcessEdgesAtTopOfScanbeam(const long64 topY)
{
  TEdge* e = m_ActiveEdges;
  while( e )
  {
    //1. process maxima, treating them as if they're 'bent' horizontal edges,
    //   but exclude maxima with horizontal edges. nb: e can't be a horizontal.
    if( IsMaxima(e, topY) && !NEAR_EQUAL(GetMaximaPair(e)->dx, HORIZONTAL) )
    {
      //'e' might be removed from AEL, as may any following edges so ...
      TEdge* ePrior = e->prevInAEL;
      DoMaxima(e, topY);
      if( !ePrior ) e = m_ActiveEdges;
      else e = ePrior->nextInAEL;
    }
    else
    {
      //2. promote horizontal edges, otherwise update xcurr and ycurr ...
      if(  IsIntermediate(e, topY) && NEAR_EQUAL(e->nextInLML->dx, HORIZONTAL) )
      {
        if (e->outIdx >= 0)
        {
          AddOutPt(e, IntPoint(e->xtop, e->ytop));

          for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
          {
            IntPoint pt, pt2;
            HorzJoinRec* hj = m_HorizJoins[i];
            if (GetOverlapSegment(IntPoint(hj->edge->xbot, hj->edge->ybot),
              IntPoint(hj->edge->xtop, hj->edge->ytop),
              IntPoint(e->nextInLML->xbot, e->nextInLML->ybot),
              IntPoint(e->nextInLML->xtop, e->nextInLML->ytop), pt, pt2))
                AddJoin(hj->edge, e->nextInLML, hj->savedIdx, e->outIdx);
          }

          AddHorzJoin(e->nextInLML, e->outIdx);
        }
        UpdateEdgeIntoAEL(e);
        AddEdgeToSEL(e);
      } else
      {
        //this just simplifies horizontal processing ...
        e->xcurr = TopX( *e, topY );
        e->ycurr = topY;
      }
      e = e->nextInAEL;
    }
  }

  //3. Process horizontals at the top of the scanbeam ...
  ProcessHorizontals();

  //4. Promote intermediate vertices ...
  e = m_ActiveEdges;
  while( e )
  {
    if( IsIntermediate( e, topY ) )
    {
      if( e->outIdx >= 0 ) AddOutPt(e, IntPoint(e->xtop,e->ytop));
      UpdateEdgeIntoAEL(e);

      //if output polygons share an edge, they'll need joining later ...
      if (e->outIdx >= 0 && e->prevInAEL && e->prevInAEL->outIdx >= 0 &&
        e->prevInAEL->xcurr == e->xbot && e->prevInAEL->ycurr == e->ybot &&
        SlopesEqual(IntPoint(e->xbot,e->ybot), IntPoint(e->xtop, e->ytop),
          IntPoint(e->xbot,e->ybot),
          IntPoint(e->prevInAEL->xtop, e->prevInAEL->ytop), m_UseFullRange))
      {
        AddOutPt(e->prevInAEL, IntPoint(e->xbot, e->ybot));
        AddJoin(e, e->prevInAEL);
      }
      else if (e->outIdx >= 0 && e->nextInAEL && e->nextInAEL->outIdx >= 0 &&
        e->nextInAEL->ycurr > e->nextInAEL->ytop &&
        e->nextInAEL->ycurr <= e->nextInAEL->ybot &&
        e->nextInAEL->xcurr == e->xbot && e->nextInAEL->ycurr == e->ybot &&
        SlopesEqual(IntPoint(e->xbot,e->ybot), IntPoint(e->xtop, e->ytop),
          IntPoint(e->xbot,e->ybot),
          IntPoint(e->nextInAEL->xtop, e->nextInAEL->ytop), m_UseFullRange))
      {
        AddOutPt(e->nextInAEL, IntPoint(e->xbot, e->ybot));
        AddJoin(e, e->nextInAEL);
      }
    }
    e = e->nextInAEL;
  }
}